

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O0

pair<long,_long> sinStrokeFunction(Coord x)

{
  long lVar1;
  double dVar2;
  pair<long,_long> pVar3;
  long local_40;
  long local_38;
  long local_30;
  Coord end;
  Coord base;
  Coord x_local;
  
  base = x;
  dVar2 = std::sin((double)(ulong)(uint)(((float)(x + -0xc) / 30.0) * 6.283184));
  lVar1 = std::lround((double)(ulong)(uint)(SUB84(dVar2,0) * 10.0));
  end = 0x3a - lVar1;
  dVar2 = std::sin((double)(ulong)(uint)(((float)(base + -0xb) / 30.0) * 6.283184));
  local_30 = std::lround((double)(ulong)(uint)(SUB84(dVar2,0) * 10.0));
  local_30 = 0x3a - local_30;
  local_40 = local_30;
  if (end == local_30) {
    local_40 = end + 1;
  }
  local_38 = local_40;
  pVar3 = std::make_pair<long&,long>(&end,&local_38);
  return pVar3;
}

Assistant:

std::pair<Coord,Coord> sinStrokeFunction(Coord x) {
    // To understand the apparently random numbers below (58, 10, 12 and 11),
    // see line 115
    Coord base = 58 - std::lround(10*std::sin(2*3.141592f*((x - 12)/30.0f)));
    Coord end  = 58 - std::lround(10*std::sin(2*3.141592f*((x - 11)/30.0f)));
    // When drawing a horizontal segment, base equals end and
    // stroke would have 0 width: so we make it 1px wide
    return std::make_pair(base, (base != end) ? end : base + 1);
}